

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramActiveUniformNameCase::test
          (ProgramActiveUniformNameCase *this)

{
  ostringstream *this_00;
  int *this_01;
  TestContext *pTVar1;
  int iVar2;
  undefined4 uVar3;
  GLuint GVar4;
  GLuint shader;
  GLuint program;
  long lVar5;
  CallLogWrapper *this_02;
  GLuint uniformIndex;
  GLuint local_a28;
  GLint size;
  allocator<char> local_a1d;
  GLenum type;
  GLuint local_a18;
  GLuint local_a14;
  CallLogWrapper *local_a10;
  char *uniformNames [3];
  StateQueryMemoryWriteGuard<unsigned_int[3]> uniformIndices;
  StateQueryMemoryWriteGuard<int> uniformNameLen;
  long local_9a8 [13];
  ios_base local_940 [264];
  char buffer [2048];
  
  this_02 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShader(this_02,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(this_02,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_02,GVar4,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_02,shader,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_02,GVar4);
  glu::CallLogWrapper::glCompileShader(this_02,shader);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_02);
  glu::CallLogWrapper::glAttachShader(this_02,program,GVar4);
  local_a14 = shader;
  glu::CallLogWrapper::glAttachShader(this_02,program,shader);
  glu::CallLogWrapper::glLinkProgram(this_02,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_02,program,0x8b86,3);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  buffer._0_8_ = buffer + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)buffer,"uniformNameWithLength23","");
  verifyProgramParam(pTVar1,this_02,program,0x8b87,buffer._8_4_ + 1);
  if ((char *)buffer._0_8_ != buffer + 0x10) {
    operator_delete((void *)buffer._0_8_,buffer._16_8_ + 1);
  }
  lVar5 = 0;
  local_a18 = GVar4;
  ApiCase::expectError(&this->super_ApiCase,0);
  uniformNames[2] = "uniformMat4";
  uniformNames[0] = "uniformNameWithLength23";
  uniformNames[1] = "uniformVec2";
  uniformIndices.m_value[1] = 0xdededede;
  uniformIndices.m_value[2] = 0xdededede;
  uniformIndices.m_postguard[0] = 0xdededede;
  uniformIndices.m_postguard[1] = 0xdededede;
  uniformIndices.m_preguard[0] = 0xdededede;
  uniformIndices.m_preguard[1] = 0xdededede;
  uniformIndices.m_preguard[2] = 0xdededede;
  uniformIndices.m_value[0] = 0xdededede;
  uniformIndices.m_postguard[2] = 0xdededede;
  glu::CallLogWrapper::glGetUniformIndices(this_02,program,3,uniformNames,uniformIndices.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
            (&uniformIndices,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  this_00 = (ostringstream *)(buffer + 8);
  do {
    uniformIndex = uniformIndices.m_value[lVar5];
    uniformNameLen.m_preguard = -0x21212122;
    uniformNameLen.m_value = -0x21212122;
    uniformNameLen.m_postguard = -0x21212122;
    glu::CallLogWrapper::glGetActiveUniformsiv
              (this_02,program,1,&uniformIndex,0x8a39,&uniformNameLen.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
              (&uniformNameLen,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buffer,uniformNames[lVar5],(allocator<char> *)&size);
    uVar3 = buffer._8_4_;
    if ((char *)buffer._0_8_ != buffer + 0x10) {
      operator_delete((void *)buffer._0_8_,buffer._16_8_ + 1);
    }
    if (uVar3 + 1 != uniformNameLen.m_value) {
      buffer._0_8_ = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
                     ->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: Expected ",0x13);
      std::ostream::operator<<(this_00,uVar3 + 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"got ",4);
      std::ostream::operator<<(this_00,uniformNameLen.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(buffer + 0x78));
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar1->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  this_01 = &uniformNameLen.m_postguard;
  lVar5 = 0;
  local_a28 = program;
  local_a10 = this_02;
  do {
    memset(buffer,0,0x800);
    buffer[0] = 'x';
    GVar4 = uniformIndices.m_value[lVar5];
    uniformIndex = 0;
    size = 0;
    type = 0;
    glu::CallLogWrapper::glGetActiveUniform
              (this_02,local_a28,GVar4,0x800,(GLsizei *)&uniformIndex,&size,&type,buffer);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniformNameLen,uniformNames[lVar5],&local_a1d);
    iVar2 = uniformNameLen.m_postguard;
    if ((long *)uniformNameLen._0_8_ != local_9a8) {
      operator_delete((void *)uniformNameLen._0_8_,local_9a8[0] + 1);
    }
    if (uniformIndex != iVar2) {
      uniformNameLen._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"// ERROR: Expected ",0x13);
      std::ostream::operator<<(this_01,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"got ",4);
      std::ostream::operator<<(this_01,uniformIndex);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&uniformNameLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_940);
      this_02 = local_a10;
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar1->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
    uniformIndex = 0;
    glu::CallLogWrapper::glGetActiveUniform
              (this_02,local_a28,GVar4,1,(GLsizei *)&uniformIndex,&size,&type,buffer);
    if (uniformIndex != 0) {
      uniformNameLen._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uniformNameLen.m_postguard);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uniformNameLen.m_postguard,"// ERROR: Expected 0 got ",0x19);
      std::ostream::operator<<(&uniformNameLen.m_postguard,uniformIndex);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&uniformNameLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uniformNameLen.m_postguard);
      std::ios_base::~ios_base(local_940);
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar1->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  glu::CallLogWrapper::glDeleteShader(this_02,local_a18);
  glu::CallLogWrapper::glDeleteShader(this_02,local_a14);
  glu::CallLogWrapper::glDeleteProgram(this_02,local_a28);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp float uniformNameWithLength23;\n"
			"uniform highp vec2 uniformVec2;\n"
			"uniform highp mat4 uniformMat4;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0) + vec4(uniformNameWithLength23) + vec4(uniformVec2.x) + vec4(uniformMat4[2][3]);\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_UNIFORMS, 3);
		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_UNIFORM_MAX_LENGTH, (GLint)std::string("uniformNameWithLength23").length() + 1); // including a null terminator
		expectError(GL_NO_ERROR);

		const char* uniformNames[] =
		{
			"uniformNameWithLength23",
			"uniformVec2",
			"uniformMat4"
		};
		StateQueryMemoryWriteGuard<GLuint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformIndices;
		glGetUniformIndices(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformNames, uniformIndices);
		uniformIndices.verifyValidity(m_testCtx);

		// check name lengths
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformNames); ++ndx)
		{
			const GLuint uniformIndex = uniformIndices[ndx];

			StateQueryMemoryWriteGuard<GLint> uniformNameLen;
			glGetActiveUniformsiv(program, 1, &uniformIndex, GL_UNIFORM_NAME_LENGTH, &uniformNameLen);

			uniformNameLen.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(uniformNames[ndx]).length() + 1;
			if (referenceLength != uniformNameLen) // uniformNameLen is with null terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << referenceLength << "got " << uniformNameLen << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}
		}

		// check names
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformNames); ++ndx)
		{
			char buffer[2048] = {'x'};

			const GLuint uniformIndex = uniformIndices[ndx];

			GLint written = 0; // null terminator not included
			GLint size = 0;
			GLenum type = 0;
			glGetActiveUniform(program, uniformIndex, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);

			const GLint referenceLength = (GLint)std::string(uniformNames[ndx]).length();
			if (referenceLength != written)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << referenceLength << "got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}

			// and with too small buffer
			written = 0;
			glGetActiveUniform(program, uniformIndex, 1, &written, &size, &type, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 0 got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}
		}


		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}